

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

void __thiscall kratos::GeneratorGraph::GeneratorGraph(GeneratorGraph *this,Generator *generator)

{
  undefined1 local_c8 [8];
  GeneratorVisitor visitor;
  GeneratorGraphVisitor g_visitor;
  
  (this->nodes_)._M_h._M_buckets = &(this->nodes_)._M_h._M_single_bucket;
  (this->nodes_)._M_h._M_bucket_count = 1;
  (this->nodes_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodes_)._M_h._M_element_count = 0;
  (this->nodes_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodes_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodes_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->root_ = generator;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8 = (undefined1  [8])&PTR_visit_root_002a8870;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)this;
  IRVisitor::visit_generator_root((IRVisitor *)local_c8,generator);
  g_visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  g_visitor.super_IRVisitor._8_8_ =
       &g_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  g_visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  g_visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  g_visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  g_visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  g_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  g_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  g_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.g_ = (GeneratorGraph *)&PTR_visit_root_002a89d0;
  g_visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)this;
  IRVisitor::visit_generator_root((IRVisitor *)&visitor.g_,generator);
  visitor.g_ = (GeneratorGraph *)&PTR_visit_root_002a8388;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&g_visitor.super_IRVisitor.level);
  local_c8 = (undefined1  [8])&PTR_visit_root_002a8388;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return;
}

Assistant:

GeneratorGraph::GeneratorGraph(Generator *generator) : root_(generator) {
    // first pass create nodes for each generator
    GeneratorVisitor visitor(this);
    visitor.visit_generator_root(generator);
    // second pass to build the graph
    GeneratorGraphVisitor g_visitor(this);
    g_visitor.visit_generator_root(generator);
}